

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O1

int * __thiscall
CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::operator[]
          (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this,int *key)

{
  uint uVar1;
  pointer pvVar2;
  pair<int,_int> *ppVar3;
  ValueIterator VVar4;
  pair<int,_int> *ppVar5;
  size_t bucketIdx;
  ulong local_10;
  ValueT local_8;
  
  uVar1 = *key;
  local_8.second = 0;
  local_8.first = uVar1;
  pvVar2 = (this->mBuckets).
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_10 = (ulong)(long)(int)uVar1 %
             (ulong)(((long)(this->mBuckets).
                            super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                    -0x5555555555555555);
  ppVar3 = *(pointer *)
            ((long)&pvVar2[local_10].
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl + 8);
  for (ppVar5 = *(pair<int,_int> **)
                 &pvVar2[local_10].
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl;
      (VVar4._M_current = ppVar3, ppVar5 != ppVar3 &&
      (VVar4._M_current = ppVar5, ppVar5->first != uVar1)); ppVar5 = ppVar5 + 1) {
  }
  if (VVar4._M_current == ppVar3) {
    VVar4 = insert_to_bucket(this,&local_8,&local_10);
  }
  return &(VVar4._M_current)->second;
}

Assistant:

MappedT& operator[](const KeyT& key) {
      size_t bucketIdx = hash_to_bucket(key);
      ValueIterator it = find_in_bucket(mBuckets[bucketIdx],key);
      if (it == mBuckets[bucketIdx].end()) { // if not found, insert the new one
        it = insert_to_bucket(std::make_pair(key, MappedT()),bucketIdx);
      }
      return it->second;
    }